

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O2

void __thiscall GmmLib::GmmXe2_LPGCachePolicy::SetUpMOCSTable(GmmXe2_LPGCachePolicy *this)

{
  Context *pCVar1;
  GmmGen12CachePolicy *pGVar2;
  uint32_t j;
  long lVar3;
  
  pCVar1 = *(Context **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    pCVar1->CachePolicyTbl[lVar3].L3.UshortValue =
         pCVar1->CachePolicyTbl[lVar3].L3.UshortValue & 3 | 0x3c;
  }
  pCVar1->CachePolicyTbl[0].L3.UshortValue = pCVar1->CachePolicyTbl[0].L3.UshortValue & 3 | 0xc;
  pCVar1->CachePolicyTbl[1].L3.UshortValue = pCVar1->CachePolicyTbl[1].L3.UshortValue & 3 | 0x10c;
  pCVar1->CachePolicyTbl[2].L3.UshortValue = pCVar1->CachePolicyTbl[2].L3.UshortValue & 3 | 0x130;
  pCVar1->CachePolicyTbl[3].L3.UshortValue = pCVar1->CachePolicyTbl[3].L3.UshortValue & 3 | 0x13c;
  pCVar1->CachePolicyTbl[4].L3.UshortValue = pCVar1->CachePolicyTbl[4].L3.UshortValue & 3 | 0x100;
  pGVar2 = &(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy;
  (pGVar2->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
  CurrentMaxMocsIndex = 4;
  (pGVar2->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
  CurrentMaxL1HdcMocsIndex = 0;
  (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
  CurrentMaxSpecialMocsIndex = 0;
  return;
}

Assistant:

void GmmLib::GmmXe2_LPGCachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define L3_WB (0x0)
#define L3_XD (pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush ? 0x1 : 0x0)
#define L3_UC (0x3)

#define GMM_DEFINE_MOCS(indx, L4Caching, L3Caching, L3ClassOfService, ignorePAT) \
    {                                                                            \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L4CC      = L4Caching;        \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.Reserved0 = 0;                \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L3CC      = L3Caching;        \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L3CLOS    = L3ClassOfService; \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.igPAT     = ignorePAT;        \
    }

    // clang-format off
    // Default MOCS Table
    for(uint32_t j = 0; j < GMM_XE2_NUM_MOCS_ENTRIES; j++)
    {   //               Index            CachingPolicy   L3Caching      L3ClassOfService    ignorePAT
        GMM_DEFINE_MOCS( j,               L4_UC,          L3_UC,             0          ,     0  )
    }

    //             Index    L4 CachingPolicy   L3 CachingPolicy   L3 CLOS   ignorePAT
    GMM_DEFINE_MOCS( 0      , L4_UC              , L3_WB           , 0     , 0)   // Defer to PAT
    GMM_DEFINE_MOCS( 1      , L4_UC              , L3_WB           , 0     , 1)   // L3
    GMM_DEFINE_MOCS( 2      , L4_WB              , L3_UC           , 0     , 1)   // L4
    GMM_DEFINE_MOCS( 3      , L4_UC              , L3_UC           , 0     , 1)   // UC
    GMM_DEFINE_MOCS( 4      , L4_WB              , L3_WB           , 0     , 1)   // L3+L4

    CurrentMaxMocsIndex = 4;
    CurrentMaxL1HdcMocsIndex   = 0;
    CurrentMaxSpecialMocsIndex = 0;
    // clang-format on

#undef GMM_DEFINE_MOCS
#undef L4_WB
#undef L4_WT
#undef L4_UC

#undef L3_WB
#undef L3_XD
#undef L3_UC
}